

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.c
# Opt level: O3

char * blogc_sysinfo_get_datetime(void)

{
  time_t tVar1;
  tm *__tp;
  size_t sVar2;
  char *pcVar3;
  time_t tmp;
  char buf [1024];
  time_t local_410;
  char local_408 [1032];
  
  tVar1 = time(&local_410);
  if (((tVar1 != -1) && (__tp = gmtime(&local_410), __tp != (tm *)0x0)) &&
     (sVar2 = strftime(local_408,0x400,"%Y-%m-%d %H:%M:%S",__tp), sVar2 != 0)) {
    pcVar3 = bc_strdup(local_408);
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

char*
blogc_sysinfo_get_datetime(void)
{
#ifndef HAVE_SYSINFO_DATETIME
    return NULL;
#else
    time_t tmp;
    if (-1 == time(&tmp))
        return NULL;

    struct tm *t = gmtime(&tmp);
    if (t == NULL)
        return NULL;

    char buf[1024];
    if (0 == strftime(buf, sizeof(buf), "%Y-%m-%d %H:%M:%S", t))
        return NULL;

    return bc_strdup(buf);
#endif
}